

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O0

void rdr_loadpat(rdr_t *rdr,FILE *file)

{
  int iVar1;
  char *__s;
  size_t sVar2;
  ushort **ppuVar3;
  void *pvVar4;
  FILE *in_RSI;
  long in_RDI;
  pat_t *pat;
  int end;
  char *line;
  undefined4 in_stack_ffffffffffffffc8;
  uint32_t in_stack_ffffffffffffffcc;
  uint in_stack_ffffffffffffffd4;
  FILE *in_stack_ffffffffffffffd8;
  int local_1c;
  
  while ((iVar1 = feof(in_RSI), iVar1 == 0 &&
         (__s = rdr_readline(in_stack_ffffffffffffffd8), __s != (char *)0x0))) {
    sVar2 = strcspn(__s,"#");
    local_1c = (int)sVar2;
    while( true ) {
      in_stack_ffffffffffffffd4 = in_stack_ffffffffffffffd4 & 0xffffff;
      if (local_1c != 0) {
        ppuVar3 = __ctype_b_loc();
        in_stack_ffffffffffffffd4 =
             CONCAT13(((*ppuVar3)[(int)__s[local_1c + -1]] & 0x2000) != 0,
                      (int3)in_stack_ffffffffffffffd4);
      }
      if ((char)(in_stack_ffffffffffffffd4 >> 0x18) == '\0') break;
      local_1c = local_1c + -1;
    }
    if (local_1c == 0) {
      free(__s);
    }
    else {
      __s[local_1c] = '\0';
      iVar1 = tolower((int)*__s);
      *__s = (char)iVar1;
      in_stack_ffffffffffffffd8 = (FILE *)pat_comp(line);
      *(int *)(in_RDI + 4) = *(int *)(in_RDI + 4) + 1;
      iVar1 = (int)*__s;
      if (iVar1 == 0x2a) {
        *(int *)(in_RDI + 8) = *(int *)(in_RDI + 8) + 1;
        *(int *)(in_RDI + 0xc) = *(int *)(in_RDI + 0xc) + 1;
      }
      else if (iVar1 == 0x62) {
        *(int *)(in_RDI + 0xc) = *(int *)(in_RDI + 0xc) + 1;
      }
      else if (iVar1 == 0x75) {
        *(int *)(in_RDI + 8) = *(int *)(in_RDI + 8) + 1;
      }
      else {
        fatal("unknown pattern type \'%c\'",(ulong)(uint)(int)*__s);
      }
      pvVar4 = xrealloc((void *)CONCAT44(in_stack_ffffffffffffffd4,iVar1),
                        CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      *(void **)(in_RDI + 0x18) = pvVar4;
      *(FILE **)(*(long *)(in_RDI + 0x18) + (ulong)(*(int *)(in_RDI + 4) - 1) * 8) =
           in_stack_ffffffffffffffd8;
      if (*(uint *)(in_RDI + 0x10) < *(uint *)&in_stack_ffffffffffffffd8->_IO_read_ptr) {
        in_stack_ffffffffffffffcc = *(uint32_t *)&in_stack_ffffffffffffffd8->_IO_read_ptr;
      }
      else {
        in_stack_ffffffffffffffcc = *(uint32_t *)(in_RDI + 0x10);
      }
      *(uint32_t *)(in_RDI + 0x10) = in_stack_ffffffffffffffcc;
    }
  }
  return;
}

Assistant:

void rdr_loadpat(rdr_t *rdr, FILE *file) {
	while (!feof(file)) {
		// Read raw input line
		char *line = rdr_readline(file);
		if (line == NULL)
			break;
		// Remove comments and trailing spaces
		int end = strcspn(line, "#");
		while (end != 0 && isspace(line[end - 1]))
			end--;
		if (end == 0) {
			free(line);
			continue;
		}
		line[end] = '\0';
		line[0] = tolower(line[0]);
		// Compile pattern and add it to the list
		pat_t *pat = pat_comp(line);
		rdr->npats++;
		switch (line[0]) {
			case 'u': rdr->nuni++; break;
			case 'b': rdr->nbi++; break;
			case '*': rdr->nuni++;
			          rdr->nbi++; break;
			default:
				fatal("unknown pattern type '%c'", line[0]);
		}
		rdr->pats = xrealloc(rdr->pats, sizeof(char *) * rdr->npats);
		rdr->pats[rdr->npats - 1] = pat;
		rdr->ntoks = max(rdr->ntoks, pat->ntoks);
	}
}